

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode getinfo_double(Curl_easy *data,CURLINFO info,double *param_doublep)

{
  double local_40;
  double local_38;
  double *param_doublep_local;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    *param_doublep = (double)(data->progress).timespent / 1000000.0;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    *param_doublep = (double)(data->progress).t_nslookup / 1000000.0;
    break;
  case CURLINFO_CONNECT_TIME:
    *param_doublep = (double)(data->progress).t_connect / 1000000.0;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    *param_doublep = (double)(data->progress).t_pretransfer / 1000000.0;
    break;
  case CURLINFO_SIZE_UPLOAD:
    *param_doublep = (double)(data->progress).uploaded;
    break;
  case CURLINFO_SIZE_DOWNLOAD:
    *param_doublep = (double)(data->progress).downloaded;
    break;
  case CURLINFO_SPEED_DOWNLOAD:
    *param_doublep = (double)(data->progress).dlspeed;
    break;
  case CURLINFO_SPEED_UPLOAD:
    *param_doublep = (double)(data->progress).ulspeed;
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40U) == 0) {
      local_38 = -1.0;
    }
    else {
      local_38 = (double)(data->progress).size_dl;
    }
    *param_doublep = local_38;
    break;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20U) == 0) {
      local_40 = -1.0;
    }
    else {
      local_40 = (double)(data->progress).size_ul;
    }
    *param_doublep = local_40;
    break;
  case CURLINFO_STARTTRANSFER_TIME:
    *param_doublep = (double)(data->progress).t_starttransfer / 1000000.0;
    break;
  case CURLINFO_REDIRECT_TIME:
    *param_doublep = (double)(data->progress).t_redirect / 1000000.0;
    break;
  case CURLINFO_APPCONNECT_TIME:
    *param_doublep = (double)(data->progress).t_appconnect / 1000000.0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode getinfo_double(struct Curl_easy *data, CURLINFO info,
                               double *param_doublep)
{
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    *param_doublep = DOUBLE_SECS(data->progress.timespent);
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    *param_doublep = DOUBLE_SECS(data->progress.t_nslookup);
    break;
  case CURLINFO_CONNECT_TIME:
    *param_doublep = DOUBLE_SECS(data->progress.t_connect);
    break;
  case CURLINFO_APPCONNECT_TIME:
    *param_doublep = DOUBLE_SECS(data->progress.t_appconnect);
    break;
  case CURLINFO_PRETRANSFER_TIME:
    *param_doublep = DOUBLE_SECS(data->progress.t_pretransfer);
    break;
  case CURLINFO_STARTTRANSFER_TIME:
    *param_doublep = DOUBLE_SECS(data->progress.t_starttransfer);
    break;
  case CURLINFO_SIZE_UPLOAD:
    *param_doublep =  (double)data->progress.uploaded;
    break;
  case CURLINFO_SIZE_DOWNLOAD:
    *param_doublep = (double)data->progress.downloaded;
    break;
  case CURLINFO_SPEED_DOWNLOAD:
    *param_doublep =  (double)data->progress.dlspeed;
    break;
  case CURLINFO_SPEED_UPLOAD:
    *param_doublep = (double)data->progress.ulspeed;
    break;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    *param_doublep = (data->progress.flags & PGRS_DL_SIZE_KNOWN)?
      (double)data->progress.size_dl:-1;
    break;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    *param_doublep = (data->progress.flags & PGRS_UL_SIZE_KNOWN)?
      (double)data->progress.size_ul:-1;
    break;
  case CURLINFO_REDIRECT_TIME:
    *param_doublep = DOUBLE_SECS(data->progress.t_redirect);
    break;

  default:
    return CURLE_UNKNOWN_OPTION;
  }

  return CURLE_OK;
}